

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-cubic.c
# Opt level: O0

void cubic_on_acked(quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,uint64_t largest_acked,
                   uint32_t inflight,int64_t now,uint32_t max_udp_payload_size)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong in_RCX;
  uint in_EDX;
  long in_RSI;
  quicly_cc_t *in_RDI;
  uint in_R8D;
  int64_t in_R9;
  cubic_float_t t_sec_00;
  double rtt_sec_00;
  cubic_float_t w_cubic_target;
  uint32_t w_est;
  uint32_t w_cubic;
  cubic_float_t rtt_sec;
  cubic_float_t t_sec;
  
  if (in_R8D < in_EDX) {
    __assert_fail("inflight >= bytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/cc-cubic.c"
                  ,0x42,
                  "void cubic_on_acked(quicly_cc_t *, const quicly_loss_t *, uint32_t, uint64_t, uint32_t, int64_t, uint32_t)"
                 );
  }
  if (in_RDI->recovery_end <= in_RCX) {
    if (in_RDI->cwnd < in_RDI->ssthresh) {
      in_RDI->cwnd = in_EDX + in_RDI->cwnd;
      if (in_RDI->cwnd_maximum < in_RDI->cwnd) {
        in_RDI->cwnd_maximum = in_RDI->cwnd;
      }
    }
    else {
      t_sec_00 = calc_cubic_t(in_RDI,in_R9);
      rtt_sec_00 = (double)*(uint *)(in_RSI + 100) / 1000.0;
      uVar1 = calc_w_cubic(in_RDI,t_sec_00,w_cubic_target._0_4_);
      uVar2 = calc_w_est(in_RDI,t_sec_00,rtt_sec_00,w_cubic_target._0_4_);
      if (uVar1 < uVar2) {
        if (in_RDI->cwnd < uVar2) {
          in_RDI->cwnd = uVar2;
        }
      }
      else {
        uVar1 = calc_w_cubic(in_RDI,t_sec_00 + rtt_sec_00,w_cubic_target._0_4_);
        if ((double)in_RDI->cwnd < (double)uVar1) {
          in_RDI->cwnd = (uint32_t)
                         (long)(((double)uVar1 / (double)in_RDI->cwnd + -1.0) *
                                (double)w_cubic_target._0_4_ + (double)in_RDI->cwnd);
        }
      }
      if (in_RDI->cwnd_maximum < in_RDI->cwnd) {
        in_RDI->cwnd_maximum = in_RDI->cwnd;
      }
    }
  }
  return;
}

Assistant:

static void cubic_on_acked(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, uint64_t largest_acked, uint32_t inflight,
                           int64_t now, uint32_t max_udp_payload_size)
{
    assert(inflight >= bytes);
    /* Do not increase congestion window while in recovery. */
    if (largest_acked < cc->recovery_end)
        return;

    /* Slow start. */
    if (cc->cwnd < cc->ssthresh) {
        cc->cwnd += bytes;
        if (cc->cwnd_maximum < cc->cwnd)
            cc->cwnd_maximum = cc->cwnd;
        return;
    }

    /* Congestion avoidance. */
    cubic_float_t t_sec = calc_cubic_t(cc, now);
    cubic_float_t rtt_sec = loss->rtt.smoothed / (cubic_float_t)1000; /* ms -> s */

    uint32_t w_cubic = calc_w_cubic(cc, t_sec, max_udp_payload_size);
    uint32_t w_est = calc_w_est(cc, t_sec, rtt_sec, max_udp_payload_size);

    if (w_cubic < w_est) {
        /* RFC 8312, Section 4.2; TCP-Friendly Region */
        /* Prevent cwnd from shrinking if W_est is reduced due to RTT increase */
        if (w_est > cc->cwnd)
            cc->cwnd = w_est;
    } else {
        /* RFC 8312, Section 4.3/4.4; CUBIC Region */
        cubic_float_t w_cubic_target = calc_w_cubic(cc, t_sec + rtt_sec, max_udp_payload_size);
        /* After fast convergence W_max < W_last_max holds, and hence W_cubic(0) = beta * W_max < beta * W_last_max = cwnd.
         * cwnd could thus shrink without this check (but only after fast convergence). */
        if (w_cubic_target > cc->cwnd)
            /* (W_cubic(t+RTT) - cwnd)/cwnd * MSS = (W_cubic(t+RTT)/cwnd - 1) * MSS */
            cc->cwnd += ((w_cubic_target / cc->cwnd) - 1) * max_udp_payload_size;
    }

    if (cc->cwnd_maximum < cc->cwnd)
        cc->cwnd_maximum = cc->cwnd;
}